

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O2

void wolffstep<trng::mrg3>(mrg3 *R,lattice *s,double T)

{
  coord r;
  bool bVar1;
  result_type_conflict rVar2;
  int iVar3;
  int iVar4;
  bernoulli_dist<bool> B;
  uniform_int_dist U;
  queue<coord,_std::deque<coord,_std::allocator<coord>_>_> buffer;
  coord local_b0;
  double local_a8;
  bernoulli_dist<bool> local_a0;
  uniform_int_dist local_8c;
  _Deque_base<coord,_std::allocator<coord>_> local_80;
  
  local_a8 = T;
  std::queue<coord,std::deque<coord,std::allocator<coord>>>::
  queue<std::deque<coord,std::allocator<coord>>,void>
            ((queue<coord,_std::deque<coord,_std::allocator<coord>_>_> *)&local_80);
  local_a0.P.p_ = exp(-2.0 / local_a8);
  local_8c.P.b_ = s->L;
  local_8c.P.a_ = 0;
  local_a0.P.p_ = 1.0 - local_a0.P.p_;
  local_a0.P.head_ = true;
  local_a0.P.tail_ = false;
  local_8c.P.d_ = local_8c.P.b_;
  local_b0.x = trng::uniform_int_dist::operator()(&local_8c,R);
  rVar2 = trng::uniform_int_dist::operator()(&local_8c,R);
  local_b0.y = rVar2;
  r = local_b0;
  iVar3 = lattice::get(s,local_b0);
  lattice::flipp(s,r);
  std::deque<coord,_std::allocator<coord>_>::push_back
            ((deque<coord,_std::allocator<coord>_> *)&local_80,&local_b0);
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_b0 = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<coord,_std::allocator<coord>_>::pop_front
              ((deque<coord,_std::allocator<coord>_> *)&local_80);
    local_b0.x = local_b0.x + -1;
    iVar4 = lattice::get(s,local_b0);
    if (iVar4 == iVar3) {
      bVar1 = trng::bernoulli_dist<bool>::operator()(&local_a0,R);
      if (bVar1) {
        std::deque<coord,_std::allocator<coord>_>::push_back
                  ((deque<coord,_std::allocator<coord>_> *)&local_80,&local_b0);
        lattice::flipp(s,local_b0);
      }
    }
    local_b0.x = local_b0.x + 2;
    iVar4 = lattice::get(s,local_b0);
    if (iVar4 == iVar3) {
      bVar1 = trng::bernoulli_dist<bool>::operator()(&local_a0,R);
      if (bVar1) {
        std::deque<coord,_std::allocator<coord>_>::push_back
                  ((deque<coord,_std::allocator<coord>_> *)&local_80,&local_b0);
        lattice::flipp(s,local_b0);
      }
    }
    iVar4 = local_b0.y;
    local_b0.x = local_b0.x + -1;
    local_b0.y = iVar4 + -1;
    iVar4 = lattice::get(s,local_b0);
    if (iVar4 == iVar3) {
      bVar1 = trng::bernoulli_dist<bool>::operator()(&local_a0,R);
      if (bVar1) {
        std::deque<coord,_std::allocator<coord>_>::push_back
                  ((deque<coord,_std::allocator<coord>_> *)&local_80,&local_b0);
        lattice::flipp(s,local_b0);
      }
    }
    local_b0.y = local_b0.y + 2;
    iVar4 = lattice::get(s,local_b0);
    if (iVar4 == iVar3) {
      bVar1 = trng::bernoulli_dist<bool>::operator()(&local_a0,R);
      if (bVar1) {
        std::deque<coord,_std::allocator<coord>_>::push_back
                  ((deque<coord,_std::allocator<coord>_> *)&local_80,&local_b0);
        lattice::flipp(s,local_b0);
      }
    }
    local_b0.y = local_b0.y + -1;
  }
  std::_Deque_base<coord,_std::allocator<coord>_>::~_Deque_base(&local_80);
  return;
}

Assistant:

void wolffstep(RNG_type &R, lattice &s, double T) {
  std::queue<coord> buffer;
  const double padd = 1.0 - std::exp(-2.0 / T);

  trng::uniform_int_dist U(0, s.size());
  trng::bernoulli_dist<bool> B(padd, true, false);
  coord r;

  r.x = U(R);
  r.y = U(R);
  const int oldspin{s.get(r)};
  s.flipp(r);
  buffer.push(r);
  while (!buffer.empty()) {
    r = buffer.front();
    buffer.pop();
    --r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.x;
    ++r.x;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.x;
    --r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    ++r.y;
    ++r.y;
    if (s.get(r) == oldspin)
      if (B(R)) {
        buffer.push(r);
        s.flipp(r);
      }
    --r.y;
  }
}